

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O3

void * ltmemalign(size_t align,size_t size)

{
  void *pvVar1;
  
  pvVar1 = ltmalloc<false>(-align & (align + size) - 1);
  return pvVar1;
}

Assistant:

void* ltmemalign(size_t align, size_t size) {
#ifdef LTALLOC_OVERFLOW_DETECTION
	size_t align_minus_one = align - 1;
	void* p = ltmalloc(((size + LTALLOC_CANARY_SIZE + align_minus_one) & ~align_minus_one) - LTALLOC_CANARY_SIZE);
	LTALLOC_ASSERT(((uintptr_t)p % align) == 0);
	return p;
#else
	return --align, ltmalloc((size + align) & ~align);
#endif
}